

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  exr_coding_channel_info_t *peVar6;
  uint8_t *puVar7;
  uint uVar8;
  char cVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  uint uVar17;
  ulong uVar18;
  float *pfVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  ushort uVar23;
  long lVar24;
  
  iVar2 = (decode->chunk).height;
  uVar10 = iVar2 - decode->user_line_end_ignore;
  if (uVar10 == 0 || iVar2 < decode->user_line_end_ignore) {
    return 0;
  }
  iVar2 = decode->user_line_begin_skip;
  lVar21 = (long)iVar2;
  pvVar22 = decode->unpacked_buffer;
  uVar18 = 0;
  do {
    iVar12 = 5;
    if (0 < decode->channel_count) {
      iVar3 = (decode->chunk).start_y;
      peVar6 = decode->channels;
      lVar24 = 0;
      do {
        puVar7 = peVar6[lVar24].field_12.decode_to_ptr;
        iVar4 = peVar6[lVar24].width;
        iVar5 = peVar6[lVar24].y_samples;
        iVar14 = (int)peVar6[lVar24].bytes_per_element;
        lVar20 = (long)peVar6[lVar24].user_pixel_stride;
        if (iVar5 < 2) {
          if (((long)uVar18 < lVar21) || (puVar7 == (uint8_t *)0x0)) {
            pvVar22 = (void *)((long)pvVar22 + (long)(iVar14 * iVar4));
            iVar12 = 7;
          }
          else {
            lVar11 = (long)peVar6[lVar24].user_line_stride * (uVar18 - lVar21);
LAB_00132709:
            pfVar19 = (float *)(puVar7 + lVar11);
            uVar1 = peVar6[lVar24].data_type;
            iVar12 = 1;
            if (uVar1 == 0) {
              uVar1 = peVar6[lVar24].user_data_type;
              if (uVar1 == 2) {
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    *pfVar19 = (float)*(uint *)((long)pvVar22 + lVar11 * 4);
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
              else if (uVar1 == 1) {
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    uVar17 = *(uint *)((long)pvVar22 + lVar11 * 4);
                    uVar23 = 0x7c00;
                    if (uVar17 < 0xffe1) {
                      fVar16 = (float)(int)uVar17;
                      if ((uint)fVar16 < 0x38800000) {
                        if ((uint)fVar16 < 0x33000001) {
                          uVar23 = 0;
                        }
                        else {
                          uVar17 = (uint)fVar16 & 0x7fffff | 0x800000;
                          cVar9 = (char)((uint)fVar16 >> 0x17);
                          uVar23 = (ushort)(uVar17 >> (0x7eU - cVar9 & 0x1f));
                          if (0x80000000 < uVar17 << (cVar9 + 0xa2U & 0x1f)) {
                            uVar23 = uVar23 + 1;
                          }
                        }
                      }
                      else if ((uint)fVar16 < 0x7f800000) {
                        if ((uint)fVar16 < 0x477ff000) {
                          uVar23 = (ushort)((int)fVar16 + 0x8000fff +
                                            (uint)(((uint)fVar16 >> 0xd & 1) != 0) >> 0xd);
                        }
                      }
                      else if (fVar16 != INFINITY) {
                        uVar17 = (uint)fVar16 >> 0xd & 0x3ff;
                        uVar23 = (ushort)(uVar17 == 0) | (ushort)uVar17 | 0x7c00;
                      }
                    }
                    *(ushort *)pfVar19 = uVar23;
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
              else {
                if (uVar1 != 0) goto LAB_00132b86;
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    *pfVar19 = *(float *)((long)pvVar22 + lVar11 * 4);
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
            }
            else if (uVar1 == 2) {
              uVar1 = peVar6[lVar24].user_data_type;
              if (uVar1 == 2) {
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    *pfVar19 = *(float *)((long)pvVar22 + lVar11 * 4);
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
              else if (uVar1 == 1) {
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    uVar17 = *(uint *)((long)pvVar22 + lVar11 * 4);
                    uVar15 = uVar17 & 0x7fffffff;
                    uVar23 = (ushort)(uVar17 >> 0x10) & 0x8000;
                    if (uVar15 < 0x38800000) {
                      if ((0x33000000 < uVar15) &&
                         (uVar17 = uVar17 & 0x7fffff | 0x800000, cVar9 = (char)(uVar15 >> 0x17),
                         uVar23 = uVar23 | (ushort)(uVar17 >> (0x7eU - cVar9 & 0x1f)),
                         0x80000000 < uVar17 << (cVar9 + 0xa2U & 0x1f))) {
                        uVar23 = uVar23 + 1;
                      }
                    }
                    else if (uVar15 < 0x7f800000) {
                      if (uVar15 < 0x477ff000) {
                        uVar23 = (ushort)(uVar15 + 0x8000fff + (uint)((uVar15 >> 0xd & 1) != 0) >>
                                         0xd) | uVar23;
                      }
                      else {
                        uVar23 = uVar23 | 0x7c00;
                      }
                    }
                    else {
                      uVar23 = uVar23 | 0x7c00;
                      if (uVar15 != 0x7f800000) {
                        uVar17 = uVar15 >> 0xd & 0x3ff;
                        uVar23 = uVar23 | (ushort)uVar17 | (ushort)(uVar17 == 0);
                      }
                    }
                    *(ushort *)pfVar19 = uVar23;
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
              else {
                if (uVar1 != 0) goto LAB_00132b86;
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    fVar16 = *(float *)((long)pvVar22 + lVar11 * 4);
                    fVar13 = 0.0;
                    if (0.0 <= fVar16) {
                      fVar13 = (float)(long)fVar16;
                      if (ABS(fVar16) == INFINITY) {
                        fVar13 = -NAN;
                      }
                      if (4.2949673e+09 < fVar16) {
                        fVar13 = -NAN;
                      }
                    }
                    *pfVar19 = fVar13;
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
            }
            else {
              if (uVar1 != 1) goto LAB_00132b86;
              uVar1 = peVar6[lVar24].user_data_type;
              if (uVar1 == 2) {
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    uVar17 = (uint)*(short *)((long)pvVar22 + lVar11 * 2);
                    uVar15 = (uVar17 & 0x7fff) << 0xd;
                    fVar16 = (float)(uVar17 & 0x80000000);
                    if (uVar15 < 0x800000) {
                      if ((uVar17 & 0x7fff) != 0) {
                        uVar8 = 0x1f;
                        if ((uVar17 & 0x7fff) != 0) {
                          for (; uVar15 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                          }
                        }
                        iVar12 = (uVar8 ^ 0x1f) - 8;
                        fVar16 = (float)(((uint)fVar16 | uVar15 << ((byte)iVar12 & 0x1f) |
                                         0x38800000) + iVar12 * -0x800000);
                      }
                    }
                    else if (uVar15 < 0xf800000) {
                      fVar16 = (float)(((uint)fVar16 | uVar15) + 0x38000000);
                    }
                    else {
                      fVar16 = (float)((uint)fVar16 | uVar15 | 0x7f800000);
                    }
                    *pfVar19 = fVar16;
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
              else if (uVar1 == 1) {
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    *(ushort *)pfVar19 = *(ushort *)((long)pvVar22 + lVar11 * 2);
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
              else {
                if (uVar1 != 0) goto LAB_00132b86;
                if (0 < iVar4) {
                  lVar11 = 0;
                  do {
                    uVar23 = *(ushort *)((long)pvVar22 + lVar11 * 2);
                    uVar17 = (uint)uVar23;
                    if ((short)uVar23 < 0) {
                      fVar16 = 0.0;
                    }
                    else if ((~uVar17 & 0x7c00) == 0) {
                      fVar16 = (float)-(uint)((uVar23 & 0x3ff) == 0);
                    }
                    else {
                      uVar15 = uVar17 * 0x2000;
                      if (uVar17 < 0x400) {
                        if (uVar23 == 0) {
                          fVar16 = 0.0;
                        }
                        else {
                          uVar8 = 0x1f;
                          if (uVar17 != 0) {
                            for (; uVar15 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                            }
                          }
                          iVar12 = (uVar8 ^ 0x1f) - 8;
                          fVar16 = (float)((uVar15 << ((byte)iVar12 & 0x1f) | 0x38800000) +
                                          iVar12 * -0x800000);
                        }
                      }
                      else if (uVar17 < 0x7c00) {
                        fVar16 = (float)(uVar15 + 0x38000000);
                      }
                      else {
                        fVar16 = (float)(uVar15 | 0x7f800000);
                      }
                      fVar16 = (float)(long)fVar16;
                    }
                    *pfVar19 = fVar16;
                    pfVar19 = (float *)((long)pfVar19 + lVar20);
                    lVar11 = lVar11 + 1;
                  } while (iVar4 != (int)lVar11);
                }
              }
            }
            pvVar22 = (void *)((long)pvVar22 + (long)(iVar4 * iVar14));
            iVar12 = 0;
          }
        }
        else {
          iVar12 = 7;
          if ((iVar3 + (int)uVar18) % iVar5 == 0) {
            if ((lVar21 <= (long)uVar18) && (puVar7 != (uint8_t *)0x0)) {
              lVar11 = (long)peVar6[lVar24].user_line_stride * (long)(((int)uVar18 - iVar2) / iVar5)
              ;
              goto LAB_00132709;
            }
            pvVar22 = (void *)((long)pvVar22 + (long)(iVar14 * iVar4));
          }
        }
LAB_00132b86:
        if ((iVar12 != 7) && (iVar12 != 0)) goto LAB_00132ba5;
        lVar24 = lVar24 + 1;
      } while (lVar24 < decode->channel_count);
      iVar12 = 5;
    }
LAB_00132ba5:
    if ((iVar12 != 5) && (iVar12 != 0)) {
      return 3;
    }
    uVar18 = uVar18 + 1;
    if (uVar18 == uVar10) {
      return 0;
    }
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;

    uls = decode->user_line_begin_skip;
    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * user data starts at user line begin skip but because of
     * y_samples > 1 case, need to embed the run the loop and skip,
     * incrementing srcbuffer only when there'd be a line...
     */
    for (int y = 0; y < h; ++y)
    {
        int cury = (int)( (int64_t) y +
                          (int64_t) decode->chunk.start_y );

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            /* avoid a mod operation if we can */
            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata +=
                    ((uint64_t) ((y - uls) / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else
            {
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata += ((uint64_t) (y - uls)) * ((uint64_t) decc->user_line_stride);
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}